

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deferred_guardedTests.cpp
# Opt level: O0

void __thiscall
deferred_guarded_deferred_guarded_1_Test::TestBody(deferred_guarded_deferred_guarded_1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  int *lhs;
  char *in_R9;
  string local_258;
  AssertHelper local_238;
  Message local_230;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1f0;
  Message local_1e8;
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1a8;
  Message local_1a0;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar__1;
  thread local_170;
  thread th3;
  thread local_158;
  thread th2;
  thread local_140;
  thread th1;
  atomic<bool> th3_ok;
  atomic<bool> th2_ok;
  atomic<bool> th1_ok;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  AssertHelper local_e8;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_;
  shared_handle data_handle;
  anon_class_1_0_00000001_for__M_fn local_9d;
  int local_9c;
  undefined1 local_98 [8];
  deferred_guarded<int,_std::shared_timed_mutex> data;
  deferred_guarded_deferred_guarded_1_Test *this_local;
  
  local_9c = 0;
  data.m_pendingList.m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)this;
  gmlc::libguarded::deferred_guarded<int,_std::shared_timed_mutex>::deferred_guarded<int>
            ((deferred_guarded<int,_std::shared_timed_mutex> *)local_98,&local_9c);
  gmlc::libguarded::deferred_guarded<int,std::shared_timed_mutex>::
  modify_detach<deferred_guarded_deferred_guarded_1_Test::TestBody()::__0>
            ((deferred_guarded<int,std::shared_timed_mutex> *)local_98,&local_9d);
  gmlc::libguarded::deferred_guarded<int,_std::shared_timed_mutex>::lock_shared
            ((shared_handle *)&gtest_ar_.message_,
             (deferred_guarded<int,_std::shared_timed_mutex> *)local_98);
  testing::AssertionResult::
  AssertionResult<gmlc::libguarded::shared_lock_handle<int,std::shared_timed_mutex>>
            ((AssertionResult *)local_d8,
             (shared_lock_handle<int,_std::shared_timed_mutex> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_d8,(AssertionResult *)0x1b02ff,"false"
               ,"true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/deferred_guardedTests.cpp"
               ,0x28,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  lhs = gmlc::libguarded::shared_lock_handle<int,_std::shared_timed_mutex>::operator*
                  ((shared_lock_handle<int,_std::shared_timed_mutex> *)&gtest_ar_.message_);
  local_11c = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_118,"*data_handle","1",lhs,&local_11c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffed0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/deferred_guardedTests.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffed0,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffed0);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  th1._M_id._M_thread._7_1_ = 1;
  th1._M_id._M_thread._6_1_ = 1;
  th1._M_id._M_thread._5_1_ = 1;
  th2._M_id._M_thread = (id)local_98;
  std::thread::thread<deferred_guarded_deferred_guarded_1_Test::TestBody()::__1,,void>
            (&local_140,(type *)&th2);
  th3._M_id._M_thread = (id)local_98;
  std::thread::thread<deferred_guarded_deferred_guarded_1_Test::TestBody()::__2,,void>
            (&local_158,(type *)&th3);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )local_98;
  std::thread::thread<deferred_guarded_deferred_guarded_1_Test::TestBody()::__3,,void>
            (&local_170,(type *)&gtest_ar__1.message_);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  local_191 = std::atomic::operator_cast_to_bool((atomic *)((long)&th1._M_id._M_thread + 7));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_190,&local_191,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_190,
               (AssertionResult *)"th1_ok == true","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/deferred_guardedTests.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1d9 = std::atomic::operator_cast_to_bool((atomic *)((long)&th1._M_id._M_thread + 6));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_1d8,
               (AssertionResult *)"th2_ok == true","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/deferred_guardedTests.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  local_221 = std::atomic::operator_cast_to_bool((atomic *)((long)&th1._M_id._M_thread + 5));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_220,&local_221,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_258,(internal *)local_220,(AssertionResult *)"th3_ok == true","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/deferred_guardedTests.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  std::thread::~thread(&local_170);
  std::thread::~thread(&local_158);
  std::thread::~thread(&local_140);
  gmlc::libguarded::shared_lock_handle<int,_std::shared_timed_mutex>::~shared_lock_handle
            ((shared_lock_handle<int,_std::shared_timed_mutex> *)&gtest_ar_.message_);
  gmlc::libguarded::deferred_guarded<int,_std::shared_timed_mutex>::~deferred_guarded
            ((deferred_guarded<int,_std::shared_timed_mutex> *)local_98);
  return;
}

Assistant:

TEST(deferred_guarded, deferred_guarded_1)
{
    deferred_guarded<int, shared_mutex> data(0);

    data.modify_detach([](int& value) { ++value; });

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        std::thread th1([&data, &th1_ok]() {
            auto data_handle2 = data.try_lock_shared();
            if (!data_handle2) {
                th1_ok = false;
            }
            if (*data_handle2 != 1) {
                th1_ok = false;
            }
        });

        std::thread th2([&data, &th2_ok]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            if (!data_handle2) {
                th2_ok = false;
            }
            if (*data_handle2 != 1) {
                th2_ok = false;
            }
        });

        std::thread th3([&data, &th3_ok]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            if (!data_handle2) {
                th3_ok = false;
            }
            if (*data_handle2 != 1) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();
        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }
}